

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

error_code llvm::errorToErrorCode(Error *Err)

{
  _func_int **pp_Var1;
  _Alloc_hider _Var2;
  int iVar3;
  ErrorList *List;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var4;
  ErrorInfoBase *pEVar5;
  _func_int **pp_Var6;
  error_code eVar7;
  error_code EC;
  ErrorInfoBase *local_90;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_88;
  anon_class_8_1_3fcf615c local_80;
  Error local_78;
  ulong local_70;
  error_code local_68;
  string local_58;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_38;
  
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  pEVar5 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  _Var4._M_head_impl = (ErrorInfoBase *)((ulong)pEVar5 & 0xfffffffffffffffe);
  local_80.EC = &local_68;
  if (_Var4._M_head_impl == (ErrorInfoBase *)0x0) goto LAB_00172e63;
  iVar3 = (*(_Var4._M_head_impl)->_vptr_ErrorInfoBase[6])(_Var4._M_head_impl,&ErrorList::ID);
  if ((char)iVar3 == '\0') {
    local_38._M_head_impl = _Var4._M_head_impl;
    handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
              ((llvm *)&local_90,
               (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
               &local_38,&local_80);
    _Var4._M_head_impl = local_38._M_head_impl;
    pEVar5 = local_90;
    if (local_38._M_head_impl != (ErrorInfoBase *)0x0) goto LAB_00172e52;
  }
  else {
    local_90 = (ErrorInfoBase *)0x1;
    pp_Var6 = _Var4._M_head_impl[1]._vptr_ErrorInfoBase;
    pp_Var1 = _Var4._M_head_impl[2]._vptr_ErrorInfoBase;
    pEVar5 = local_90;
    if (pp_Var6 != pp_Var1) {
      pEVar5 = (ErrorInfoBase *)0x1;
      do {
        local_88._M_head_impl = (ErrorInfoBase *)*pp_Var6;
        *pp_Var6 = (_func_int *)0x0;
        local_78.Payload = pEVar5;
        handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                  ((llvm *)&local_70,
                   (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   &local_88,&local_80);
        ErrorList::join((ErrorList *)&local_58,&local_78,(Error *)&local_70);
        _Var2._M_p = local_58._M_dataplus._M_p;
        local_58._M_dataplus._M_p = (pointer)0x0;
        if ((long *)(local_70 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(local_70 & 0xfffffffffffffffe) + 8))();
        }
        if (local_88._M_head_impl != (ErrorInfoBase *)0x0) {
          (*(local_88._M_head_impl)->_vptr_ErrorInfoBase[1])();
        }
        local_88._M_head_impl = (ErrorInfoBase *)0x0;
        if ((long *)((ulong)local_78.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_78.Payload & 0xfffffffffffffffe) + 8))();
        }
        pEVar5 = (ErrorInfoBase *)((ulong)_Var2._M_p | 1);
        pp_Var6 = pp_Var6 + 1;
      } while (pp_Var6 != pp_Var1);
    }
LAB_00172e52:
    local_90 = pEVar5;
    (*(_Var4._M_head_impl)->_vptr_ErrorInfoBase[1])(_Var4._M_head_impl);
  }
  if ((ErrorInfoBase *)0x1 < local_90) {
    llvm_unreachable_internal
              ("Failure value returned from cantFail wrapped call",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
               ,0x2be);
  }
LAB_00172e63:
  if (ErrorErrorCat.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              (&ErrorErrorCat.super_ManagedStaticBase,
               object_creator<(anonymous_namespace)::ErrorErrorCategory>::call,
               object_deleter<(anonymous_namespace)::ErrorErrorCategory>::call);
  }
  eVar7._4_4_ = 0;
  eVar7._M_value = local_68._M_value;
  if (local_68._M_value == 2 &&
      (__base_type)local_68._M_cat == ErrorErrorCat.super_ManagedStaticBase.Ptr._M_b._M_p) {
    (**(code **)(*(long *)local_68._M_cat + 0x20))(&local_58,local_68._M_cat,2);
    report_fatal_error(&local_58,true);
  }
  eVar7._M_cat = local_68._M_cat;
  return eVar7;
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}